

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O1

void __thiscall FListMenuItemPlayerDisplay::Drawer(FListMenuItemPlayerDisplay *this,bool selected)

{
  FState *pFVar1;
  BYTE *pBVar2;
  bool bVar3;
  FTextureID FVar4;
  char *in_RAX;
  long lVar5;
  DVector2 *pDVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  FTexture *pFVar10;
  FRemapTable *pFVar11;
  int iVar12;
  int iVar13;
  int left;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  FString portrait;
  
  portrait.Chars = in_RAX;
  if ((this->mMode == '\0') && (bVar3 = UpdatePlayerClass(this), !bVar3)) {
    return;
  }
  FString::AttachToOther(&portrait,&this->mPlayerClass->Type->Portrait);
  if (((*(int *)(portrait.Chars + -0xc) != 0) && (this->mNoportrait == false)) &&
     (FVar4 = FTextureManager::CheckForTexture(&TexMan,portrait.Chars,8,1), 0 < FVar4.texnum)) {
    if ((uint)FVar4.texnum < TexMan.Textures.Count) {
      pFVar10 = TexMan.Textures.Array[TexMan.Translation.Array[(uint)FVar4.texnum]].Texture;
    }
    else {
      pFVar10 = (FTexture *)0x0;
    }
    if (pFVar10 != (FTexture *)0x0) {
      DCanvas::DrawTexture
                ((DCanvas *)screen,pFVar10,(double)(this->super_FListMenuItem).mXpos,
                 (double)(this->super_FListMenuItem).mYpos,0x40001390,1,0);
      goto LAB_00314d8c;
    }
  }
  left = ((screen->super_DSimpleCanvas).super_DCanvas.Width >> 1) +
         ((this->super_FListMenuItem).mXpos + -0xa0) * CleanXfac;
  iVar12 = ((this->super_FListMenuItem).mYpos + -100) * CleanYfac;
  iVar13 = (screen->super_DSimpleCanvas).super_DCanvas.Height >> 1;
  DCanvas::DrawTexture
            ((DCanvas *)screen,this->mBackdrop,(double)left,(double)(iVar13 + iVar12 + -1),
             0x40001389,(ulong)(uint)(CleanXfac * 0x48),0x4000138a,(ulong)(uint)(CleanYfac * 0x50),
             0x4000138e,&this->mRemap,0x400013a5,1,0);
  iVar13 = iVar13 + iVar12;
  V_DrawFrame(left,iVar13,CleanXfac * 0x48,CleanYfac * 0x50 + -1);
  pFVar1 = this->mPlayerState;
  if (pFVar1 == (FState *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar7 = (long)this->mSkin;
    if (lVar7 == 0) {
      lVar5 = (long)&((spriteframe_t *)((SpriteFrames.Array)->Texture + -2))->Voxel +
              (ulong)((uint)sprites.Array[pFVar1->sprite].spriteframes * 0x50) +
              (ulong)((uint)pFVar1->Frame * 0x50);
      pBVar2 = (this->mPlayerClass->Type->super_PClassActor).super_PClass.Defaults;
      pDVar6 = (DVector2 *)(pBVar2 + 0xf8);
      pdVar8 = (double *)(pBVar2 + 0x100);
    }
    else {
      pDVar6 = &skins[lVar7].Scale;
      lVar5 = (long)&((spriteframe_t *)((SpriteFrames.Array)->Texture + -2))->Voxel +
              (ulong)((uint)sprites.Array[skins[lVar7].sprite].spriteframes * 0x50) +
              (ulong)((uint)pFVar1->Frame * 0x50);
      pdVar8 = &skins[lVar7].Scale.Y;
    }
    in_XMM4_Qa = *pdVar8;
    in_XMM3_Qa = pDVar6->X;
  }
  if (lVar5 != 0) {
    uVar9 = (ulong)*(int *)(lVar5 + 8 + (ulong)this->mRotation * 4);
    if (uVar9 < TexMan.Textures.Count) {
      pFVar10 = TexMan.Textures.Array[TexMan.Translation.Array[uVar9]].Texture;
    }
    else {
      pFVar10 = (FTexture *)0x0;
    }
    if ((pFVar10 != (FTexture *)0x0) && (pFVar10->UseType != '\r')) {
      if (this->mTranslate == '\0') {
        pFVar11 = (FRemapTable *)0x0;
      }
      else {
        pFVar11 = translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[8].Ptr;
      }
      DCanvas::DrawTexture
                ((DCanvas *)screen,pFVar10,(double)(left + CleanXfac * 0x24),
                 (double)(CleanYfac * 0x47 + iVar13),0x400013af,
                 ((double)CleanXfac * in_XMM3_Qa * (double)pFVar10->Width) / (pFVar10->Scale).X,
                 ((double)CleanYfac * in_XMM4_Qa * (double)pFVar10->Height) / (pFVar10->Scale).Y,
                 0x400013b0,0x4000138e,pFVar11,0x40001395,
                 (ulong)(1 << (this->mRotation & 0x1f) & (uint)*(ushort *)(lVar5 + 0x48)),0);
    }
  }
LAB_00314d8c:
  FString::~FString(&portrait);
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::Drawer(bool selected)
{
	if (mMode == 0 && !UpdatePlayerClass())
	{
		return;
	}

	FString portrait = mPlayerClass->Type->Portrait;

	if (portrait.IsNotEmpty() && !mNoportrait)
	{
		FTextureID texid = TexMan.CheckForTexture(portrait, FTexture::TEX_MiscPatch);
		if (texid.isValid())
		{
			FTexture *tex = TexMan(texid);
			if (tex != NULL)
			{
				screen->DrawTexture (tex, mXpos, mYpos, DTA_Clean, true, TAG_DONE);
				return;
			}
		}
	}
	int x = (mXpos - 160) * CleanXfac + (SCREENWIDTH>>1);
	int y = (mYpos - 100) * CleanYfac + (SCREENHEIGHT>>1);

	screen->DrawTexture (mBackdrop, x, y - 1,
		DTA_DestWidth, 72 * CleanXfac,
		DTA_DestHeight, 80 * CleanYfac,
		DTA_Translation, &mRemap,
		DTA_Masked, true,
		TAG_DONE);

	V_DrawFrame (x, y, 72*CleanXfac, 80*CleanYfac-1);

	spriteframe_t *sprframe = NULL;
	DVector2 Scale;

	if (mPlayerState != NULL)
	{
		if (mSkin == 0)
		{
			sprframe = &SpriteFrames[sprites[mPlayerState->sprite].spriteframes + mPlayerState->GetFrame()];
			Scale = GetDefaultByType(mPlayerClass->Type)->Scale;
		}
		else
		{
			sprframe = &SpriteFrames[sprites[skins[mSkin].sprite].spriteframes + mPlayerState->GetFrame()];
			Scale = skins[mSkin].Scale;
		}
	}

	if (sprframe != NULL)
	{
		FTexture *tex = TexMan(sprframe->Texture[mRotation]);
		if (tex != NULL && tex->UseType != FTexture::TEX_Null)
		{
			FRemapTable *trans = NULL;
			if (mTranslate) trans = translationtables[TRANSLATION_Players](MAXPLAYERS);
			screen->DrawTexture (tex,
				x + 36*CleanXfac, y + 71*CleanYfac,
				DTA_DestWidthF, tex->GetScaledWidthDouble() * CleanXfac * Scale.X,
				DTA_DestHeightF, tex->GetScaledHeightDouble() * CleanYfac * Scale.Y,
				DTA_Translation, trans,
				DTA_FlipX, sprframe->Flip & (1 << mRotation),
				TAG_DONE);
		}
	}
}